

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges.cpp
# Opt level: O0

real sdf_tools::sdf::distanceToEdge(real2 r,real2 a,real2 b)

{
  float *pfVar1;
  real rVar2;
  real2 in_XMM0_Qa;
  real2 b_00;
  undefined8 in_XMM1_Qa;
  real2 p;
  real alpha;
  real ab_length;
  real2 ar;
  real2 ab;
  real2 in_stack_ffffffffffffff48;
  real2 in_stack_ffffffffffffff50;
  real2 in_stack_ffffffffffffff58;
  float local_74;
  real2 local_70;
  real2 local_68;
  float local_5c;
  real2 local_58;
  float local_4c;
  undefined8 local_48;
  real2 local_40;
  real2 local_38;
  real2 local_20;
  undefined8 local_10;
  real2 local_8;
  
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  local_20 = sdf_tools::operator-(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_40 = local_8;
  local_48 = local_10;
  local_38 = sdf_tools::operator-(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  local_58 = local_20;
  local_4c = length(in_stack_ffffffffffffff50);
  local_68 = local_20;
  local_70 = local_38;
  rVar2 = dot(local_20,local_38);
  local_5c = rVar2 / local_4c;
  local_74 = 0.0;
  pfVar1 = std::min<float>(&local_4c,&local_5c);
  pfVar1 = std::max<float>(&local_74,pfVar1);
  local_5c = *pfVar1;
  sdf_tools::operator*(0.0,in_stack_ffffffffffffff48);
  b_00 = operator+(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  sdf_tools::operator-(local_8,b_00);
  rVar2 = length(b_00);
  return rVar2;
}

Assistant:

static inline real distanceToEdge(real2 r, real2 a, real2 b)
{
    const real2 ab = b - a;
    const real2 ar = r - a;
    const real ab_length = length(ab);
    real alpha = dot(ab, ar) / ab_length;

    alpha = std::max((real) 0, std::min(ab_length, alpha));

    const real2 p = a + (alpha / ab_length) * ab;
    return length(r - p);
}